

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffpcl(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *array,int *status)

{
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  int colnum_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (datatype == 1) {
      ffpclx(fptr,colnum,firstrow,firstelem,nelem,(char *)array,status);
    }
    else if (datatype == 0xb) {
      ffpclb(fptr,colnum,firstrow,firstelem,nelem,(uchar *)array,status);
    }
    else if (datatype == 0xc) {
      ffpclsb(fptr,colnum,firstrow,firstelem,nelem,(char *)array,status);
    }
    else if (datatype == 0x14) {
      ffpclui(fptr,colnum,firstrow,firstelem,nelem,(unsigned_short *)array,status);
    }
    else if (datatype == 0x15) {
      ffpcli(fptr,colnum,firstrow,firstelem,nelem,(short *)array,status);
    }
    else if (datatype == 0x1e) {
      ffpcluk(fptr,colnum,firstrow,firstelem,nelem,(uint *)array,status);
    }
    else if (datatype == 0x1f) {
      ffpclk(fptr,colnum,firstrow,firstelem,nelem,(int *)array,status);
    }
    else if (datatype == 0x28) {
      ffpcluj(fptr,colnum,firstrow,firstelem,nelem,(unsigned_long *)array,status);
    }
    else if (datatype == 0x29) {
      ffpclj(fptr,colnum,firstrow,firstelem,nelem,(long *)array,status);
    }
    else if (datatype == 0x50) {
      ffpclujj(fptr,colnum,firstrow,firstelem,nelem,(ULONGLONG *)array,status);
    }
    else if (datatype == 0x51) {
      ffpcljj(fptr,colnum,firstrow,firstelem,nelem,(LONGLONG *)array,status);
    }
    else if (datatype == 0x2a) {
      ffpcle(fptr,colnum,firstrow,firstelem,nelem,(float *)array,status);
    }
    else if (datatype == 0x52) {
      ffpcld(fptr,colnum,firstrow,firstelem,nelem,(double *)array,status);
    }
    else if (datatype == 0x53) {
      ffpcle(fptr,colnum,firstrow,(firstelem + -1) * 2 + 1,nelem << 1,(float *)array,status);
    }
    else if (datatype == 0xa3) {
      ffpcld(fptr,colnum,firstrow,(firstelem + -1) * 2 + 1,nelem << 1,(double *)array,status);
    }
    else if (datatype == 0xe) {
      ffpcll(fptr,colnum,firstrow,firstelem,nelem,(char *)array,status);
    }
    else if (datatype == 0x10) {
      ffpcls(fptr,colnum,firstrow,firstelem,nelem,(char **)array,status);
    }
    else {
      *status = 0x19a;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpcl(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of elements to write             */
            void  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a table column.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS column is not the same as the array being written).

*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBIT)
    {
      ffpclx(fptr, colnum, firstrow, (long) firstelem, (long) nelem, (char *) array, 
             status);
    }
    else if (datatype == TBYTE)
    {
      ffpclb(fptr, colnum, firstrow, firstelem, nelem, (unsigned char *) array,
             status);
    }
    else if (datatype == TSBYTE)
    {
      ffpclsb(fptr, colnum, firstrow, firstelem, nelem, (signed char *) array,
             status);
    }
    else if (datatype == TUSHORT)
    {
      ffpclui(fptr, colnum, firstrow, firstelem, nelem, 
             (unsigned short *) array, status);
    }
    else if (datatype == TSHORT)
    {
      ffpcli(fptr, colnum, firstrow, firstelem, nelem, (short *) array,
             status);
    }
    else if (datatype == TUINT)
    {
      ffpcluk(fptr, colnum, firstrow, firstelem, nelem, (unsigned int *) array,
               status);
    }
    else if (datatype == TINT)
    {
      ffpclk(fptr, colnum, firstrow, firstelem, nelem, (int *) array,
               status);
    }
    else if (datatype == TULONG)
    {
      ffpcluj(fptr, colnum, firstrow, firstelem, nelem, (unsigned long *) array,
              status);
    }
    else if (datatype == TLONG)
    {
      ffpclj(fptr, colnum, firstrow, firstelem, nelem, (long *) array,
             status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpclujj(fptr, colnum, firstrow, firstelem, nelem, (ULONGLONG *) array,
             status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpcljj(fptr, colnum, firstrow, firstelem, nelem, (LONGLONG *) array,
             status);
    }
    else if (datatype == TFLOAT)
    {
      ffpcle(fptr, colnum, firstrow, firstelem, nelem, (float *) array,
             status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpcld(fptr, colnum, firstrow, firstelem, nelem, (double *) array,
             status);
    }
    else if (datatype == TCOMPLEX)
    {
      ffpcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (float *) array, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
      ffpcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (double *) array, status);
    }
    else if (datatype == TLOGICAL)
    {
      ffpcll(fptr, colnum, firstrow, firstelem, nelem, (char *) array,
             status);
    }
    else if (datatype == TSTRING)
    {
      ffpcls(fptr, colnum, firstrow, firstelem, nelem, (char **) array,
             status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}